

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::ElementsDecodeIssuance::ElementsDecodeIssuance(ElementsDecodeIssuance *this)

{
  JsonClassBase<cfd::api::json::ElementsDecodeIssuance> *in_RDI;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [20];
  allocator local_9 [9];
  
  core::JsonClassBase<cfd::api::json::ElementsDecodeIssuance>::JsonClassBase(in_RDI);
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__ElementsDecodeIssuance_00b66840;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x6c5cc7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 7),"",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xb),"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xf),"",&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  *(undefined1 *)&in_RDI[0x13]._vptr_JsonClassBase = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x14),"",&local_1f);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x18),"",&local_20);
  std::allocator<char>::~allocator((allocator<char> *)&local_20);
  in_RDI[0x1c]._vptr_JsonClassBase = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x1d),"",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  in_RDI[0x21]._vptr_JsonClassBase = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x22),"",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x26),"",&local_23);
  std::allocator<char>::~allocator((allocator<char> *)&local_23);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x2a),"",&local_24);
  std::allocator<char>::~allocator((allocator<char> *)&local_24);
  CollectFieldName();
  return;
}

Assistant:

ElementsDecodeIssuance() {
    CollectFieldName();
  }